

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall capnp::JsonCodec::decode(JsonCodec *this,Reader input,Builder output)

{
  Reader input_00;
  Builder output_00;
  Schema type_00;
  Maybe<capnp::JsonCodec::HandlerBase_*const_&> MVar1;
  BuilderArena *pBVar2;
  CapTableBuilder *pCVar3;
  Orphanage orphanage;
  StructSchema type;
  StructBuilder inner;
  Schema local_90;
  SegmentReader *local_88;
  CapTableReader *pCStack_80;
  void *local_78;
  WirePointer *pWStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  StructBuilder local_58;
  
  output_00 = output;
  local_90 = output.schema.super_Schema.raw;
  MVar1 = kj::HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*>::find<capnp::StructSchema&>
                    ((HashMap<capnp::Type,capnp::JsonCodec::HandlerBase*> *)
                     &((this->impl).ptr)->typeHandlers,(StructSchema *)&local_90);
  type_00.raw = local_90.raw;
  if (MVar1.ptr == (HandlerBase **)0x0) {
    local_88 = input._reader.segment;
    pCStack_80 = input._reader.capTable;
    local_78 = input._reader.data;
    pWStack_70 = input._reader.pointers;
    local_68 = input._reader._32_8_;
    uStack_60 = input._reader._40_8_;
    local_58.dataSize = output.builder.dataSize;
    local_58.pointerCount = output.builder.pointerCount;
    local_58._38_2_ = output.builder._38_2_;
    local_58.data = output.builder.data;
    local_58.pointers = output.builder.pointers;
    local_58.segment = output.builder.segment;
    local_58.capTable = output.builder.capTable;
    pBVar2 = capnp::_::StructBuilder::getArena(&local_58);
    pCVar3 = capnp::_::StructBuilder::getCapTable(&local_58);
    input_00._reader.capTable._0_4_ = (int)pCStack_80;
    input_00._reader.segment = local_88;
    input_00._reader.capTable._4_4_ = (int)((ulong)pCStack_80 >> 0x20);
    input_00._reader.data._0_4_ = (int)local_78;
    input_00._reader.data._4_4_ = (int)((ulong)local_78 >> 0x20);
    input_00._reader.pointers._0_4_ = (int)pWStack_70;
    input_00._reader.pointers._4_4_ = (int)((ulong)pWStack_70 >> 0x20);
    input_00._reader.dataSize = (int)local_68;
    input_00._reader._36_4_ = (int)((ulong)local_68 >> 0x20);
    input_00._reader.nestingLimit = (int)uStack_60;
    input_00._reader._44_4_ = (int)((ulong)uStack_60 >> 0x20);
    orphanage.capTable = pCVar3;
    orphanage.arena = pBVar2;
    decodeObject(this,input_00,(StructSchema)type_00.raw,orphanage,output_00);
  }
  else {
    (*(*MVar1.ptr)->_vptr_HandlerBase[2])(*MVar1.ptr,this);
  }
  return;
}

Assistant:

void JsonCodec::decode(JsonValue::Reader input, DynamicStruct::Builder output) const {
  auto type = output.getSchema();

  KJ_IF_MAYBE(handler, impl->typeHandlers.find(type)) {
    return (*handler)->decodeStructBase(*this, input, output);
  }

  decodeObject(input, type, Orphanage::getForMessageContaining(output), output);
}